

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O2

uint32_t slang::clog2(SVInt *v)

{
  bitwidth_t bVar1;
  logic_t lVar2;
  bitwidth_t bVar3;
  uint32_t uVar4;
  SVInt SStack_38;
  
  uVar4 = 0;
  SVInt::SVInt<int>(&SStack_38,0);
  lVar2 = SVInt::operator==(v,&SStack_38);
  SVInt::~SVInt(&SStack_38);
  if (((lVar2.value == '\0') || (lVar2.value == 0x80)) || (lVar2.value == '@')) {
    bVar1 = (v->super_SVIntStorage).bitWidth;
    SVInt::operator-(&SStack_38,v);
    bVar3 = SVInt::countLeadingZeros(&SStack_38);
    uVar4 = bVar1 - bVar3;
    SVInt::~SVInt(&SStack_38);
  }
  return uVar4;
}

Assistant:

inline SLANG_EXPORT uint32_t clog2(const SVInt& v) {
    if (v == 0)
        return 0;
    return v.getBitWidth() - (v - SVInt::One).countLeadingZeros();
}